

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCCurve.cpp
# Opt level: O3

void __thiscall
Assimp::IFC::anon_unknown_9::TrimmedCurve::SampleDiscrete
          (TrimmedCurve *this,TempMesh *out,IfcFloat a,IfcFloat b)

{
  element_type *peVar1;
  int iVar2;
  bool bVar3;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar4;
  IfcFloat IVar5;
  double dVar6;
  double dVar7;
  
  IVar5 = b;
  (*(this->super_BoundedCurve).super_Curve._vptr_Curve[5])();
  dVar6 = IVar5;
  iVar2 = (*(this->super_BoundedCurve).super_Curve._vptr_Curve[2])(this);
  if (((char)iVar2 != '\0') ||
     ((-1.1920928955078125e-07 < a - extraout_XMM0_Qa && (-1.1920928955078125e-07 < IVar5 - a)))) {
    (*(this->super_BoundedCurve).super_Curve._vptr_Curve[5])(this);
    iVar2 = (*(this->super_BoundedCurve).super_Curve._vptr_Curve[2])(this);
    if (((char)iVar2 != '\0') ||
       ((-1.1920928955078125e-07 < b - extraout_XMM0_Qa_00 && (-1.1920928955078125e-07 < dVar6 - b))
       )) {
      dVar6 = (this->range).first;
      dVar4 = (this->range).second;
      bVar3 = this->agree_sense != false;
      if (bVar3) {
        dVar7 = a + dVar6;
      }
      else {
        dVar7 = dVar4 - a;
      }
      peVar1 = (this->base).super___shared_ptr<const_Assimp::IFC::Curve,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      if (bVar3) {
        dVar4 = dVar6 + b;
      }
      else {
        dVar4 = dVar4 - b;
      }
      (*peVar1->_vptr_Curve[7])(dVar7,dVar4,peVar1,out);
      return;
    }
  }
  __assert_fail("InRange(a) && InRange(b)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCCurve.cpp"
                ,0x188,
                "virtual void Assimp::IFC::(anonymous namespace)::TrimmedCurve::SampleDiscrete(TempMesh &, IfcFloat, IfcFloat) const"
               );
}

Assistant:

void SampleDiscrete(TempMesh& out,IfcFloat a,IfcFloat b) const {
        ai_assert(InRange(a) && InRange(b));
        return base->SampleDiscrete(out,TrimParam(a),TrimParam(b));
    }